

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkAbcUtil.c
# Opt level: O3

Lpk_Fun_t * Lpk_FunDup(Lpk_Fun_t *p,uint *pTruth)

{
  uint uVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  uint uVar11;
  Lpk_Fun_t *pLVar12;
  void **ppvVar13;
  byte bVar14;
  ulong uVar15;
  uint nVars;
  
  uVar11 = *(uint *)&p->field_0x8;
  nVars = uVar11 >> 7 & 0x1f;
  bVar14 = (char)nVars - 5;
  if (nVars < 6) {
    bVar14 = 0;
  }
  pLVar12 = (Lpk_Fun_t *)malloc((0xcL << (bVar14 & 0x3f)) + 0xe8);
  memset(pLVar12->puSupps,0,0xd8);
  uVar1 = p->vNodes->nSize;
  pLVar12->vNodes = p->vNodes;
  *(uint *)&pLVar12->field_0x8 = uVar11 & 0x3fffff80 | uVar1 & 0x7f;
  pLVar12->nDelayLim = p->nDelayLim;
  uVar11 = Kit_TruthSupport(pTruth,nVars);
  pLVar12->uSupp = uVar11;
  uVar11 = *(uint *)&p->field_0x8 >> 7 & 0x1f;
  uVar15 = (ulong)(uint)(1 << ((char)uVar11 - 5U & 0x1f));
  if (uVar11 < 6) {
    uVar15 = 1;
  }
  memcpy(&pLVar12->field_0xe4,pTruth,uVar15 << 2);
  uVar4 = *(undefined8 *)(p->pFanins + 8);
  *(undefined8 *)pLVar12->pFanins = *(undefined8 *)p->pFanins;
  *(undefined8 *)(pLVar12->pFanins + 8) = uVar4;
  uVar4 = *(undefined8 *)p->pDelays;
  uVar5 = *(undefined8 *)(p->pDelays + 2);
  uVar6 = *(undefined8 *)(p->pDelays + 4);
  uVar7 = *(undefined8 *)(p->pDelays + 6);
  uVar8 = *(undefined8 *)(p->pDelays + 8);
  uVar9 = *(undefined8 *)(p->pDelays + 10);
  uVar10 = *(undefined8 *)(p->pDelays + 0xe);
  *(undefined8 *)(pLVar12->pDelays + 0xc) = *(undefined8 *)(p->pDelays + 0xc);
  *(undefined8 *)(pLVar12->pDelays + 0xe) = uVar10;
  *(undefined8 *)(pLVar12->pDelays + 8) = uVar8;
  *(undefined8 *)(pLVar12->pDelays + 10) = uVar9;
  *(undefined8 *)(pLVar12->pDelays + 4) = uVar6;
  *(undefined8 *)(pLVar12->pDelays + 6) = uVar7;
  *(undefined8 *)pLVar12->pDelays = uVar4;
  *(undefined8 *)(pLVar12->pDelays + 2) = uVar5;
  pVVar3 = p->vNodes;
  uVar11 = pVVar3->nSize;
  if (uVar11 == pVVar3->nCap) {
    if ((int)uVar11 < 0x10) {
      if (pVVar3->pArray == (void **)0x0) {
        ppvVar13 = (void **)malloc(0x80);
      }
      else {
        ppvVar13 = (void **)realloc(pVVar3->pArray,0x80);
      }
      pVVar3->pArray = ppvVar13;
      pVVar3->nCap = 0x10;
    }
    else {
      if (pVVar3->pArray == (void **)0x0) {
        ppvVar13 = (void **)malloc((ulong)uVar11 << 4);
      }
      else {
        ppvVar13 = (void **)realloc(pVVar3->pArray,(ulong)uVar11 << 4);
      }
      pVVar3->pArray = ppvVar13;
      pVVar3->nCap = uVar11 * 2;
    }
  }
  else {
    ppvVar13 = pVVar3->pArray;
  }
  iVar2 = pVVar3->nSize;
  pVVar3->nSize = iVar2 + 1;
  ppvVar13[iVar2] = pLVar12;
  return pLVar12;
}

Assistant:

Lpk_Fun_t * Lpk_FunDup( Lpk_Fun_t * p, unsigned * pTruth )
{
    Lpk_Fun_t * pNew;
    pNew = Lpk_FunAlloc( p->nVars );
    pNew->Id = Vec_PtrSize(p->vNodes);
    pNew->vNodes = p->vNodes;
    pNew->nVars = p->nVars;
    pNew->nLutK = p->nLutK;
    pNew->nAreaLim = p->nAreaLim;
    pNew->nDelayLim = p->nDelayLim;
    pNew->uSupp = Kit_TruthSupport( pTruth, p->nVars );
    Kit_TruthCopy( Lpk_FunTruth(pNew,0), pTruth, p->nVars );
    memcpy( pNew->pFanins, p->pFanins, 16 );
    memcpy( pNew->pDelays, p->pDelays, sizeof(int)*16 );
    Vec_PtrPush( p->vNodes, pNew );
    return pNew;
}